

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O1

void lddmc_fprintdot(FILE *out,MDD mdd)

{
  size_t __size;
  char *__ptr;
  
  fwrite("digraph \"DD\" {\n",0xf,1,(FILE *)out);
  fwrite("graph [dpi = 300];\n",0x13,1,(FILE *)out);
  fwrite("center = true;\n",0xf,1,(FILE *)out);
  fwrite("edge [dir = forward];\n",0x16,1,(FILE *)out);
  if (mdd == 1) {
    __ptr = "1 [shape=record, label=\"True\"];\n";
    __size = 0x20;
  }
  else {
    if (mdd != 0) {
      lddmc_fprintdot_rec(out,mdd);
      lddmc_fprintdot_unmark(mdd);
      goto LAB_0010f581;
    }
    __ptr = "0 [shape=record, label=\"False\"];\n";
    __size = 0x21;
  }
  fwrite(__ptr,__size,1,(FILE *)out);
LAB_0010f581:
  fwrite("}\n",2,1,(FILE *)out);
  return;
}

Assistant:

void
lddmc_fprintdot(FILE *out, MDD mdd)
{
    fprintf(out, "digraph \"DD\" {\n");
    fprintf(out, "graph [dpi = 300];\n");
    fprintf(out, "center = true;\n");
    fprintf(out, "edge [dir = forward];\n");

    // Special case: false
    if (mdd == lddmc_false) {
        fprintf(out, "0 [shape=record, label=\"False\"];\n");
        fprintf(out, "}\n");
        return;
    }

    // Special case: true
    if (mdd == lddmc_true) {
        fprintf(out, "1 [shape=record, label=\"True\"];\n");
        fprintf(out, "}\n");
        return;
    }

    lddmc_fprintdot_rec(out, mdd);
    lddmc_fprintdot_unmark(mdd);

    fprintf(out, "}\n");
}